

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

void gdImageFillToBorder(gdImagePtr im,int x,int y,int border,int color)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int c_1;
  int c;
  int restoreAlphaBleding;
  int i;
  int rightLimit;
  int leftLimit;
  int lastBorder;
  int color_local;
  int border_local;
  int y_local;
  int x_local;
  gdImagePtr im_local;
  
  if (-1 < border) {
    i = -1;
    iVar1 = im->alphaBlendingFlag;
    im->alphaBlendingFlag = 0;
    c = x;
    while ((-1 < c && (iVar3 = gdImageGetPixel(im,c,y), iVar3 != border))) {
      gdImageSetPixel(im,c,y,color);
      i = c;
      c = c + -1;
    }
    if (i == -1) {
      im->alphaBlendingFlag = iVar1;
    }
    else {
      c = x + 1;
      restoreAlphaBleding = x;
      while ((c < im->sx && (iVar3 = gdImageGetPixel(im,c,y), iVar3 != border))) {
        gdImageSetPixel(im,c,y,color);
        restoreAlphaBleding = c;
        c = c + 1;
      }
      if (0 < y) {
        bVar2 = true;
        for (c = i; c <= restoreAlphaBleding; c = c + 1) {
          iVar3 = gdImageGetPixel(im,c,y + -1);
          if (bVar2) {
            if ((iVar3 != border) && (iVar3 != color)) {
              gdImageFillToBorder(im,c,y + -1,border,color);
              bVar2 = false;
            }
          }
          else if ((iVar3 == border) || (iVar3 == color)) {
            bVar2 = true;
          }
        }
      }
      if (y < im->sy + -1) {
        bVar2 = true;
        for (c = i; c <= restoreAlphaBleding; c = c + 1) {
          iVar3 = gdImageGetPixel(im,c,y + 1);
          if (bVar2) {
            if ((iVar3 != border) && (iVar3 != color)) {
              gdImageFillToBorder(im,c,y + 1,border,color);
              bVar2 = false;
            }
          }
          else if ((iVar3 == border) || (iVar3 == color)) {
            bVar2 = true;
          }
        }
      }
      im->alphaBlendingFlag = iVar1;
    }
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageFillToBorder (gdImagePtr im, int x, int y, int border, int color)
{
	int lastBorder;
	/* Seek left */
	int leftLimit, rightLimit;
	int i;
	int restoreAlphaBleding;

	if (border < 0) {
		/* Refuse to fill to a non-solid border */
		return;
	}

	leftLimit = (-1);

	restoreAlphaBleding = im->alphaBlendingFlag;
	im->alphaBlendingFlag = 0;

	for (i = x; (i >= 0); i--) {
		if (gdImageGetPixel (im, i, y) == border) {
			break;
		}
		gdImageSetPixel (im, i, y, color);
		leftLimit = i;
	}
	if (leftLimit == (-1)) {
		im->alphaBlendingFlag = restoreAlphaBleding;
		return;
	}
	/* Seek right */
	rightLimit = x;
	for (i = (x + 1); (i < im->sx); i++) {
		if (gdImageGetPixel (im, i, y) == border) {
			break;
		}
		gdImageSetPixel (im, i, y, color);
		rightLimit = i;
	}
	/* Look at lines above and below and start paints */
	/* Above */
	if (y > 0) {
		lastBorder = 1;
		for (i = leftLimit; (i <= rightLimit); i++) {
			int c;
			c = gdImageGetPixel (im, i, y - 1);
			if (lastBorder) {
				if ((c != border) && (c != color)) {
					gdImageFillToBorder (im, i, y - 1, border, color);
					lastBorder = 0;
				}
			} else if ((c == border) || (c == color)) {
				lastBorder = 1;
			}
		}
	}
	/* Below */
	if (y < ((im->sy) - 1)) {
		lastBorder = 1;
		for (i = leftLimit; (i <= rightLimit); i++) {
			int c = gdImageGetPixel (im, i, y + 1);
			if (lastBorder) {
				if ((c != border) && (c != color)) {
					gdImageFillToBorder (im, i, y + 1, border, color);
					lastBorder = 0;
				}
			} else if ((c == border) || (c == color)) {
				lastBorder = 1;
			}
		}
	}
	im->alphaBlendingFlag = restoreAlphaBleding;
}